

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_bool_field
          (OneofWellKnownTypes *this,BoolValue *bool_field)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  BoolValue *bool_field_local;
  OneofWellKnownTypes *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  clear_oneof_field(this);
  if (bool_field != (BoolValue *)0x0) {
    submessage_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)bool_field);
    message_arena = (Arena *)bool_field;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<google::protobuf::BoolValue>
                              (message_arena_00,bool_field,submessage_arena_00);
    }
    set_has_bool_field(this);
    (this->field_0)._impl_.oneof_field_.any_field_ = (Message *)message_arena;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_bool_field(::google::protobuf::BoolValue* PROTOBUF_NULLABLE bool_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (bool_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(bool_field)->GetArena();
    if (message_arena != submessage_arena) {
      bool_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, bool_field, submessage_arena);
    }
    set_has_bool_field();
    _impl_.oneof_field_.bool_field_ = bool_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.bool_field)
}